

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int index;
  DepthImage im_1;
  string n_frames_str;
  string local_150;
  string pat_out;
  string pat_d2;
  string pat_c2;
  string pat_d1;
  string pat_c1;
  string local_90;
  DepthImage im_2;
  
  puts("\n=============================");
  printf("Randy depth composer utility");
  puts("\n=============================");
  if (argc == 7) {
    std::__cxx11::string::string((string *)&n_frames_str,argv[1],(allocator *)&im_1);
    std::__cxx11::string::string((string *)&pat_c1,argv[2],(allocator *)&im_1);
    std::__cxx11::string::string((string *)&pat_d1,argv[3],(allocator *)&im_1);
    std::__cxx11::string::string((string *)&pat_c2,argv[4],(allocator *)&im_1);
    std::__cxx11::string::string((string *)&pat_d2,argv[5],(allocator *)&im_1);
    std::__cxx11::string::string((string *)&pat_out,argv[6],(allocator *)&im_1);
    iVar1 = std::__cxx11::stoi(&n_frames_str,(size_t *)0x0,10);
    DepthImage::DepthImage(&im_1);
    DepthImage::DepthImage(&im_2);
    index = 0;
    if (iVar1 < 1) {
      iVar1 = index;
    }
    for (; iVar1 != index; index = index + 1) {
      PatternToName(&local_150,&pat_c1,index);
      PatternToName(&local_90,&pat_d1,index);
      DepthImage::EmplaceData(&im_1,&local_150,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_150);
      PatternToName(&local_150,&pat_c2,index);
      PatternToName(&local_90,&pat_d2,index);
      DepthImage::EmplaceData(&im_2,&local_150,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_150);
      DepthImage::PrintInfo(&im_1);
      DepthImage::PrintInfo(&im_2);
      DepthImage::operator+=(&im_1,&im_2);
      PatternToName(&local_150,&pat_out,index);
      DepthImage::SaveToPNG(&im_1,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
    }
    DepthImage::~DepthImage(&im_2);
    DepthImage::~DepthImage(&im_1);
    iVar1 = 0;
    std::__cxx11::string::~string((string *)&pat_out);
    std::__cxx11::string::~string((string *)&pat_d2);
    std::__cxx11::string::~string((string *)&pat_c2);
    std::__cxx11::string::~string((string *)&pat_d1);
    std::__cxx11::string::~string((string *)&pat_c1);
    std::__cxx11::string::~string((string *)&n_frames_str);
  }
  else {
    PrintUsage();
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {

    printf("\n=============================\n");
    printf("Randy depth composer utility");
    printf("\n=============================\n");

    /*Test();
    return 0;*/

    // omp_set_num_threads(2);

    if (argc != 7) {
        PrintUsage();
        return -1;
    }

    // Patse args
    std::string n_frames_str(argv[1]);
    std::string pat_c1(argv[2]);
    std::string pat_d1(argv[3]);
    std::string pat_c2(argv[4]);
    std::string pat_d2(argv[5]);
    std::string pat_out(argv[6]);
    int n_frames = 0;

    try {
        n_frames = std::stoi(n_frames_str);
    } catch (...) {
        printf("Can't parse %s as a number\n", n_frames_str.c_str());
        PrintUsage();
        return -1;
    }

    // Process textures, each thread gets an image and
    // reuses it over and over to avoid reallocations
    DepthImage im_1, im_2;

// #pragma omp parallel for private(im_1, im_2)
    for (int i = 0; i < n_frames; ++i) {

        // auto tid = omp_get_thread_num();
        // parallel_printf("\nThread #%d for task #%d \n\n", tid, i);

        // Image 1
        im_1.EmplaceData(PatternToName(pat_c1, i), PatternToName(pat_d1, i));

        // Image 2
        im_2.EmplaceData(PatternToName(pat_c2, i), PatternToName(pat_d2, i));

        // Print
        im_1.PrintInfo();
        im_2.PrintInfo();

        // Compose
        im_1 += im_2;


        // Save
        im_1.SaveToPNG(PatternToName(pat_out, i));
    }

    return 0;
}